

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

void __thiscall Catch::TextFlow::Columns::iterator::iterator(iterator *this,Columns *columns)

{
  vector<Catch::TextFlow::Column,_std::allocator<Catch::TextFlow::Column>_> *this_00;
  bool bVar1;
  size_type sVar2;
  iterator local_70;
  reference local_48;
  Column *col;
  const_iterator __end2;
  const_iterator __begin2;
  vector<Catch::TextFlow::Column,_std::allocator<Catch::TextFlow::Column>_> *__range2;
  Columns *columns_local;
  iterator *this_local;
  
  this->m_columns = &columns->m_columns;
  std::vector<Catch::TextFlow::Column::iterator,_std::allocator<Catch::TextFlow::Column::iterator>_>
  ::vector(&this->m_iterators);
  sVar2 = std::vector<Catch::TextFlow::Column,_std::allocator<Catch::TextFlow::Column>_>::size
                    (this->m_columns);
  this->m_activeIterators = sVar2;
  sVar2 = std::vector<Catch::TextFlow::Column,_std::allocator<Catch::TextFlow::Column>_>::size
                    (this->m_columns);
  std::vector<Catch::TextFlow::Column::iterator,_std::allocator<Catch::TextFlow::Column::iterator>_>
  ::reserve(&this->m_iterators,sVar2);
  this_00 = this->m_columns;
  __end2 = std::vector<Catch::TextFlow::Column,_std::allocator<Catch::TextFlow::Column>_>::begin
                     (this_00);
  col = (Column *)
        std::vector<Catch::TextFlow::Column,_std::allocator<Catch::TextFlow::Column>_>::end(this_00)
  ;
  while( true ) {
    bVar1 = __gnu_cxx::
            operator==<const_Catch::TextFlow::Column_*,_std::vector<Catch::TextFlow::Column,_std::allocator<Catch::TextFlow::Column>_>_>
                      (&__end2,(__normal_iterator<const_Catch::TextFlow::Column_*,_std::vector<Catch::TextFlow::Column,_std::allocator<Catch::TextFlow::Column>_>_>
                                *)&col);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    local_48 = __gnu_cxx::
               __normal_iterator<const_Catch::TextFlow::Column_*,_std::vector<Catch::TextFlow::Column,_std::allocator<Catch::TextFlow::Column>_>_>
               ::operator*(&__end2);
    Column::begin(&local_70,local_48);
    std::
    vector<Catch::TextFlow::Column::iterator,_std::allocator<Catch::TextFlow::Column::iterator>_>::
    push_back(&this->m_iterators,&local_70);
    __gnu_cxx::
    __normal_iterator<const_Catch::TextFlow::Column_*,_std::vector<Catch::TextFlow::Column,_std::allocator<Catch::TextFlow::Column>_>_>
    ::operator++(&__end2);
  }
  return;
}

Assistant:

Columns::iterator::iterator(Columns const &columns) :
            m_columns(columns.m_columns),
            m_activeIterators(m_columns.size()) {

            m_iterators.reserve(m_columns.size());
            for (auto const &col : m_columns) {
                m_iterators.push_back(col.begin());
            }
        }